

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall core::image::raw_to_float_image(image *this,ConstPtr *image)

{
  element_type *peVar1;
  pointer puVar2;
  long lVar3;
  invalid_argument *this_00;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  float fVar7;
  Ptr PVar8;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    Image<float>::create();
    peVar1 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    TypedImageBase<float>::allocate
              (*(TypedImageBase<float> **)this,
               (peVar1->super_TypedImageBase<unsigned_short>).super_ImageBase.w,
               (peVar1->super_TypedImageBase<unsigned_short>).super_ImageBase.h,
               (peVar1->super_TypedImageBase<unsigned_short>).super_ImageBase.c);
    peVar1 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar2 = (peVar1->super_TypedImageBase<unsigned_short>).data.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (ulong)((long)*(pointer *)
                           ((long)&(peVar1->super_TypedImageBase<unsigned_short>).data.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data + 8) - (long)puVar2) >> 1;
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar4 & 0xffffffff);
    if ((int)uVar4 < 1) {
      p_Var5 = _Var6._M_pi;
    }
    lVar3 = *(long *)this;
    for (; p_Var5 != _Var6._M_pi;
        _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(_Var6._M_pi)->_vptr__Sp_counted_base + 1)) {
      fVar7 = (float)puVar2[(long)_Var6._M_pi] / 65535.0;
      if (fVar7 <= 0.0) {
        fVar7 = 0.0;
      }
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      *(float *)(*(long *)(lVar3 + 0x18) + (long)_Var6._M_pi * 4) = fVar7;
    }
    PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

FloatImage::Ptr
raw_to_float_image (RawImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    FloatImage::Ptr img = FloatImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        float const value = static_cast<float>(image->at(i)) / 65535.0f;
        img->at(i) = std::min(1.0f, std::max(0.0f, value));
    }
    return img;
}